

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa.c
# Opt level: O3

void duckdb_je_pa_dalloc(tsdn_t *tsdn,pa_shard_t *shard,edata_t *edata,
                        _Bool *deferred_work_generated)

{
  ulong uVar1;
  pai_t *ppVar2;
  
  duckdb_je_emap_remap(tsdn,shard->emap,edata,0xe8,false);
  uVar1 = edata->e_bits;
  if (((uint)uVar1 >> 0xc & 1) != 0) {
    duckdb_je_emap_deregister_interior(tsdn,shard->emap,edata);
    uVar1 = edata->e_bits;
  }
  *(ushort *)&edata->e_addr = *(ushort *)&edata->e_addr & 0xf000;
  edata->e_bits = uVar1 & 0xfffffffff00fffff | 0xe800000;
  LOCK();
  (shard->nactive).repr = (shard->nactive).repr - ((edata->field_2).e_size_esn >> 0xc);
  UNLOCK();
  ppVar2 = &(shard->pac).pai;
  if (((uint)edata->e_bits >> 0xe & 1) != 0) {
    ppVar2 = &(shard->hpa_sec).pai;
  }
  (*ppVar2->dalloc)(tsdn,ppVar2,edata,deferred_work_generated);
  return;
}

Assistant:

void
pa_dalloc(tsdn_t *tsdn, pa_shard_t *shard, edata_t *edata,
    bool *deferred_work_generated) {
	emap_remap(tsdn, shard->emap, edata, SC_NSIZES, /* slab */ false);
	if (edata_slab_get(edata)) {
		emap_deregister_interior(tsdn, shard->emap, edata);
		/*
		 * The slab state of the extent isn't cleared.  It may be used
		 * by the pai implementation, e.g. to make caching decisions.
		 */
	}
	edata_addr_set(edata, edata_base_get(edata));
	edata_szind_set(edata, SC_NSIZES);
	pa_nactive_sub(shard, edata_size_get(edata) >> LG_PAGE);
	pai_t *pai = pa_get_pai(shard, edata);
	pai_dalloc(tsdn, pai, edata, deferred_work_generated);
}